

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O0

void R_DrawSkyPlane(visplane_t *pl)

{
  bool bVar1;
  FTextureID texnum;
  fixed_t fVar2;
  int a;
  double dVar3;
  double dVar4;
  bool local_5a;
  bool fakefixed;
  int frontxscale;
  int local_4c;
  side_t *psStack_48;
  int pos;
  side_t *s;
  line_t *l;
  int local_30;
  int local_2c;
  double local_28;
  double backdpos;
  double frontdpos;
  FTextureID sky2tex;
  FTextureID sky1tex;
  visplane_t *pl_local;
  
  _sky2tex = pl;
  FTextureID::FTextureID((FTextureID *)((long)&frontdpos + 4));
  FTextureID::FTextureID((FTextureID *)&frontdpos);
  backdpos = 0.0;
  local_28 = 0.0;
  if (((level.flags & 0x10000000) == 0) || ((level.flags & 4) != 0)) {
    frontdpos._4_4_ = (FTextureID)sky1texture.texnum;
  }
  else {
    frontdpos._4_4_ = (FTextureID)sky2texture.texnum;
  }
  frontdpos._0_4_ = (FTextureID)sky2texture.texnum;
  skymid = skytexturemid;
  skyangle = TAngle<double>::BAMs(&ViewAngle);
  bVar1 = FTextureID::operator==(&_sky2tex->picnum,&skyflatnum);
  if (!bVar1) goto LAB_00394695;
  if ((_sky2tex->sky & 0x40000000U) != 0) {
    if (_sky2tex->sky == 0x40000000) {
      l._4_4_ = frontdpos._0_4_;
      frontskytex = FTextureManager::operator()(&TexMan,frontdpos._0_4_,true);
      backskytex = (FTexture *)0x0;
      frontcyl = sky2cyl;
      skyflip = 0;
      backdpos = sky2pos;
      goto LAB_00394695;
    }
    s = (side_t *)(lines + (int)((_sky2tex->sky & 0xbfffffffU) - 1));
    psStack_48 = (side_t *)s->textures[1].yOffset;
    local_5a = false;
    if ((level.flags & 0x10000000) != 0) {
      frontxscale = (int)side_t::GetTexture(psStack_48,2);
      local_5a = FTextureID::isValid((FTextureID *)&frontxscale);
    }
    if (local_5a == false) {
      local_4c = 0;
    }
    else {
      local_4c = 2;
    }
    texnum = side_t::GetTexture(psStack_48,local_4c);
    frontskytex = FTextureManager::operator()(&TexMan,texnum,true);
    if ((frontskytex != (FTexture *)0x0) && (frontskytex->UseType != '\r')) {
      backskytex = (FTexture *)0x0;
      dVar4 = side_t::GetTextureXOffset(psStack_48,local_4c);
      fVar2 = FloatToFixed(dVar4);
      skyangle = fVar2 + skyangle;
      dVar4 = side_t::GetTextureYOffset(psStack_48,local_4c);
      skymid = dVar4 - 28.0;
      skyflip = 0xffffffff;
      if (*(int *)&s->textures[0].field_0x24 != 0) {
        skyflip = 0;
      }
      dVar4 = (frontskytex->Scale).X;
      a = FTexture::GetWidth(frontskytex);
      frontcyl = MAX<int>(a,(int)(dVar4 * 1024.0));
      dVar4 = skymid;
      if ((skystretch & 1U) != 0) {
        dVar3 = FTexture::GetScaledHeightDouble(frontskytex);
        skymid = (dVar4 * dVar3) / 228.0;
      }
      goto LAB_00394695;
    }
  }
  local_2c = frontdpos._4_4_;
  frontskytex = FTextureManager::operator()(&TexMan,frontdpos._4_4_,true);
  if ((level.flags & 4) == 0) {
    backskytex = (FTexture *)0x0;
  }
  else {
    local_30 = frontdpos._0_4_;
    backskytex = FTextureManager::operator()(&TexMan,frontdpos._0_4_,true);
  }
  skyflip = 0;
  backdpos = sky1pos;
  local_28 = sky2pos;
  frontcyl = sky1cyl;
  backcyl = sky2cyl;
LAB_00394695:
  dVar4 = fmod(backdpos,(double)sky1cyl * 65536.0);
  frontpos = (int)dVar4;
  if (backskytex != (FTexture *)0x0) {
    dVar4 = fmod(local_28,(double)sky2cyl * 65536.0);
    backpos = (int)dVar4;
  }
  bVar1 = fixedcolormap == (lighttable_t *)0x0;
  if (bVar1) {
    fixedcolormap = NormalLight.Maps;
  }
  dc_colormap = fixedcolormap;
  R_DrawSky(_sky2tex);
  if (bVar1) {
    fixedcolormap = (lighttable_t *)0x0;
  }
  return;
}

Assistant:

void R_DrawSkyPlane (visplane_t *pl)
{
	FTextureID sky1tex, sky2tex;
	double frontdpos = 0, backdpos = 0;

	if ((level.flags & LEVEL_SWAPSKIES) && !(level.flags & LEVEL_DOUBLESKY))
	{
		sky1tex = sky2texture;
	}
	else
	{
		sky1tex = sky1texture;
	}
	sky2tex = sky2texture;
	skymid = skytexturemid;
	skyangle = ViewAngle.BAMs();

	if (pl->picnum == skyflatnum)
	{
		if (!(pl->sky & PL_SKYFLAT))
		{	// use sky1
		sky1:
			frontskytex = TexMan(sky1tex, true);
			if (level.flags & LEVEL_DOUBLESKY)
				backskytex = TexMan(sky2tex, true);
			else
				backskytex = NULL;
			skyflip = 0;
			frontdpos = sky1pos;
			backdpos = sky2pos;
			frontcyl = sky1cyl;
			backcyl = sky2cyl;
		}
		else if (pl->sky == PL_SKYFLAT)
		{	// use sky2
			frontskytex = TexMan(sky2tex, true);
			backskytex = NULL;
			frontcyl = sky2cyl;
			skyflip = 0;
			frontdpos = sky2pos;
		}
		else
		{	// MBF's linedef-controlled skies
			// Sky Linedef
			const line_t *l = &lines[(pl->sky & ~PL_SKYFLAT)-1];

			// Sky transferred from first sidedef
			const side_t *s = l->sidedef[0];
			int pos;

			// Texture comes from upper texture of reference sidedef
			// [RH] If swapping skies, then use the lower sidedef
			if (level.flags & LEVEL_SWAPSKIES && s->GetTexture(side_t::bottom).isValid())
			{
				pos = side_t::bottom;
			}
			else
			{
				pos = side_t::top;
			}

			frontskytex = TexMan(s->GetTexture(pos), true);
			if (frontskytex == NULL || frontskytex->UseType == FTexture::TEX_Null)
			{ // [RH] The blank texture: Use normal sky instead.
				goto sky1;
			}
			backskytex = NULL;

			// Horizontal offset is turned into an angle offset,
			// to allow sky rotation as well as careful positioning.
			// However, the offset is scaled very small, so that it
			// allows a long-period of sky rotation.
			skyangle += FLOAT2FIXED(s->GetTextureXOffset(pos));

			// Vertical offset allows careful sky positioning.
			skymid = s->GetTextureYOffset(pos) - 28;

			// We sometimes flip the picture horizontally.
			//
			// Doom always flipped the picture, so we make it optional,
			// to make it easier to use the new feature, while to still
			// allow old sky textures to be used.
			skyflip = l->args[2] ? 0u : ~0u;

			int frontxscale = int(frontskytex->Scale.X * 1024);
			frontcyl = MAX(frontskytex->GetWidth(), frontxscale);
			if (skystretch)
			{
				skymid = skymid * frontskytex->GetScaledHeightDouble() / SKYSTRETCH_HEIGHT;
			}
		}
	}
	frontpos = int(fmod(frontdpos, sky1cyl * 65536.0));
	if (backskytex != NULL)
	{
		backpos = int(fmod(backdpos, sky2cyl * 65536.0));
	}

	bool fakefixed = false;
	if (fixedcolormap)
	{
		dc_colormap = fixedcolormap;
	}
	else
	{
		fakefixed = true;
		fixedcolormap = dc_colormap = NormalLight.Maps;
	}

	R_DrawSky (pl);

	if (fakefixed)
		fixedcolormap = NULL;
}